

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ising_model.cc
# Opt level: O2

void __thiscall lattice::resize(lattice *this,int newL)

{
  if (0 < newL) {
    this->L = newL;
    this->L2 = newL * newL;
    std::vector<int,_std::allocator<int>_>::resize(&this->s,(ulong)(uint)(newL * newL));
    return;
  }
  std::operator<<((ostream *)&std::cerr,"negative size\n");
  exit(1);
}

Assistant:

void lattice::resize(int newL) {
  if (newL > 0) {
    L = newL;
    L2 = L * L;
    s.resize(L2);
  } else {
    std::cerr << "negative size\n";
    std::exit(EXIT_FAILURE);
  }
}